

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMesh.h
# Opt level: O0

void __thiscall irr::scene::SMesh::recalculateBoundingBox(SMesh *this)

{
  bool bVar1;
  u32 uVar2;
  int iVar3;
  IMeshBuffer **ppIVar4;
  undefined4 extraout_var;
  array<irr::scene::IMeshBuffer_*> *in_RDI;
  aabbox3df *bb;
  u32 i;
  bool hasMeshBufferBBox;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 *in_stack_ffffffffffffffe8;
  uint index;
  uint uVar5;
  uint3 in_stack_fffffffffffffff4;
  uint uVar6;
  
  uVar6 = (uint)in_stack_fffffffffffffff4;
  index = 0;
  while (uVar5 = index,
        uVar2 = core::array<irr::scene::IMeshBuffer_*>::size
                          ((array<irr::scene::IMeshBuffer_*> *)0x2daed6), index < uVar2) {
    ppIVar4 = core::array<irr::scene::IMeshBuffer_*>::operator[](in_RDI,index);
    iVar3 = (*(*ppIVar4)->_vptr_IMeshBuffer[10])();
    in_stack_ffffffffffffffe8 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    bVar1 = core::aabbox3d<float>::isEmpty((aabbox3d<float> *)0x2daf0e);
    if (!bVar1) {
      if ((uVar6 & 0x1000000) == 0) {
        uVar6 = CONCAT13(1,(int3)uVar6);
        in_RDI[1].m_data.
        super__Vector_base<irr::scene::IMeshBuffer_*,_std::allocator<irr::scene::IMeshBuffer_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)*in_stack_ffffffffffffffe8;
        in_RDI[1].m_data.
        super__Vector_base<irr::scene::IMeshBuffer_*,_std::allocator<irr::scene::IMeshBuffer_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffffe8[1];
        *(undefined8 *)&in_RDI[1].is_sorted = in_stack_ffffffffffffffe8[2];
      }
      else {
        core::aabbox3d<float>::addInternalBox
                  ((aabbox3d<float> *)in_RDI,
                   (aabbox3d<float> *)CONCAT44(index,in_stack_ffffffffffffffd8));
      }
    }
    index = uVar5 + 1;
  }
  if ((uVar6 & 0x1000000) == 0) {
    core::aabbox3d<float>::reset
              ((aabbox3d<float> *)CONCAT44(uVar6,uVar5),
               (float)((ulong)in_stack_ffffffffffffffe8 >> 0x20),SUB84(in_stack_ffffffffffffffe8,0),
               (float)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void recalculateBoundingBox()
	{
		bool hasMeshBufferBBox = false;
		for (u32 i = 0; i < MeshBuffers.size(); ++i) {
			const core::aabbox3df &bb = MeshBuffers[i]->getBoundingBox();
			if (!bb.isEmpty()) {
				if (!hasMeshBufferBBox) {
					hasMeshBufferBBox = true;
					BoundingBox = bb;
				} else {
					BoundingBox.addInternalBox(bb);
				}
			}
		}

		if (!hasMeshBufferBBox)
			BoundingBox.reset(0.0f, 0.0f, 0.0f);
	}